

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O1

_Bool ksGpuWindow_Create(ksGpuWindow *window,ksDriverInstance *instance,ksGpuQueueInfo *queueInfo,
                        int queueIndex,ksGpuSurfaceColorFormat colorFormat,
                        ksGpuSurfaceDepthFormat depthFormat,ksGpuSampleCount sampleCount,int width,
                        int height,_Bool fullscreen)

{
  float *currentRefreshRate;
  int iVar1;
  int iVar2;
  uint uVar3;
  ksGpuSurfaceBits kVar4;
  Display *pDVar5;
  Window WVar6;
  XVisualInfo *pXVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  GLXContext p_Var10;
  long lVar11;
  ksGpuQueueInfo *pkVar12;
  ksGpuQueueInfo *pkVar13;
  char *pcVar14;
  long lVar15;
  _Bool _Var16;
  byte bVar17;
  int glxEventBase;
  undefined8 local_138;
  undefined8 local_130;
  int fbConfigCount;
  int glxVersionMinor;
  int glxVersionMajor;
  XSetWindowAttributes wa;
  int glxErrorBase;
  undefined4 local_48;
  
  bVar17 = 0;
  local_138 = instance;
  local_130 = queueInfo;
  memset(window,0,0x228);
  window->colorFormat = colorFormat;
  window->depthFormat = depthFormat;
  window->sampleCount = sampleCount;
  window->windowWidth = width;
  window->windowHeight = height;
  window->windowSwapInterval = 1;
  window->windowRefreshRate = 60.0;
  window->windowFullscreen = fullscreen;
  window->windowActive = false;
  window->windowExit = false;
  pDVar5 = (Display *)XOpenDisplay(0);
  window->xDisplay = pDVar5;
  if (pDVar5 == (Display *)0x0) {
    Error("Unable to open X Display.");
    return false;
  }
  iVar1 = XDefaultScreen(pDVar5);
  window->xScreen = iVar1;
  WVar6 = XRootWindow(window->xDisplay,iVar1);
  window->xRoot = WVar6;
  currentRefreshRate = &window->desktopRefreshRate;
  if (window->windowFullscreen == true) {
    ChangeVideoMode_XF86VidMode
              (window->xDisplay,window->xScreen,&window->desktopWidth,&window->desktopHeight,
               currentRefreshRate,&window->windowWidth,&window->windowHeight,
               &window->windowRefreshRate);
  }
  else {
    ChangeVideoMode_XF86VidMode
              (window->xDisplay,window->xScreen,&window->desktopWidth,&window->desktopHeight,
               currentRefreshRate,(int *)0x0,(int *)0x0,(float *)0x0);
    window->windowRefreshRate = *currentRefreshRate;
  }
  (window->device).instance = (ksDriverInstance *)0x0;
  (window->device).queueInfo.queueCount = 0;
  (window->device).queueInfo.queueProperties = 0;
  (window->device).queueInfo.queuePriorities[0xc] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xd] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xe] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xf] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[8] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[9] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[10] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xb] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[4] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[5] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[6] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[7] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[1] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[2] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[3] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).instance = local_138;
  pkVar12 = local_130;
  pkVar13 = &(window->device).queueInfo;
  for (lVar11 = 0x12; lVar11 != 0; lVar11 = lVar11 + -1) {
    pkVar13->queueCount = pkVar12->queueCount;
    pkVar12 = (ksGpuQueueInfo *)((long)pkVar12 + (ulong)bVar17 * -8 + 4);
    pkVar13 = (ksGpuQueueInfo *)((long)pkVar13 + (ulong)bVar17 * -8 + 4);
  }
  pDVar5 = window->xDisplay;
  iVar1 = window->xScreen;
  (window->context).device = &window->device;
  iVar2 = glXQueryExtension(pDVar5,&glxErrorBase,&glxEventBase);
  if (iVar2 == 0) {
    pcVar14 = "X display does not support the GLX extension.";
  }
  else {
    iVar2 = glXQueryVersion(pDVar5,&glxVersionMajor,&glxVersionMinor);
    if (iVar2 == 0) {
      pcVar14 = "Unable to retrieve GLX version.";
    }
    else {
      fbConfigCount = 0;
      lVar11 = glXGetFBConfigs(pDVar5,iVar1,&fbConfigCount);
      iVar1 = fbConfigCount;
      if (fbConfigCount != 0) {
        kVar4 = ksGpuContext_BitsForSurfaceFormat(colorFormat,depthFormat);
        if (0 < iVar1) {
          uVar3 = kVar4._0_4_;
          local_130 = (ksGpuQueueInfo *)(CONCAT44(local_130._4_4_,uVar3 >> 8) & 0xffffffff000000ff);
          local_138 = (ksDriverInstance *)
                      (CONCAT44(local_138._4_4_,uVar3 >> 0x10) & 0xffffffff000000ff);
          lVar15 = 0;
          do {
            glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0x8013,&wa);
            if ((ksGpuSampleCount)wa.background_pixmap != 0) {
              glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0x800b,&wa);
              if ((ksGpuSampleCount)wa.background_pixmap != 0) {
                glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),5,&wa);
                if ((((ksGpuSampleCount)wa.background_pixmap != 0) &&
                    (glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0x8011,&wa),
                    (wa.background_pixmap & 1) != 0)) &&
                   (glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0x8010,&wa),
                   (wa.background_pixmap & 1) != 0)) {
                  glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),8,&wa);
                  if ((ksGpuSampleCount)wa.background_pixmap == (uVar3 & 0xff)) {
                    glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),9,&wa);
                    if ((ksGpuSampleCount)wa.background_pixmap == (int)local_130) {
                      glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),10,&wa);
                      if ((ksGpuSampleCount)wa.background_pixmap == (int)local_138) {
                        glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0xb,&wa);
                        if ((ksGpuSampleCount)wa.background_pixmap == uVar3 >> 0x18) {
                          glXGetFBConfigAttrib(pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0xc,&wa);
                          if ((ksGpuSampleCount)wa.background_pixmap == (ushort)(kVar4._4_2_ >> 8))
                          {
                            if (sampleCount < KS_GPU_SAMPLE_COUNT_2) {
LAB_00115f8d:
                              glXGetFBConfigAttrib
                                        (pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0x800b,&wa);
                              (window->context).visualid = (ksGpuSampleCount)wa.background_pixmap;
                              (window->context).glxFBConfig = *(GLXFBConfig *)(lVar11 + lVar15 * 8);
                              XFree(lVar11);
                              (window->context).xDisplay = pDVar5;
                              wa.border_pixmap = 0x100009126;
                              wa.border_pixel = 0x200002094;
                              wa.background_pixmap = 0x400002091;
                              wa.background_pixel = 0x500002092;
                              wa._32_8_ = (ulong)(uint)wa.win_gravity << 0x20;
                              glXCreateContextAttribsARB =
                                   (PFNGLXCREATECONTEXTATTRIBSARBPROC)
                                   glXGetProcAddress("glXCreateContextAttribsARB");
                              p_Var10 = (*glXCreateContextAttribsARB)
                                                  (pDVar5,(window->context).glxFBConfig,
                                                   (GLXContext)0x0,1,(int *)&wa);
                              (window->context).glxContext = p_Var10;
                              if (p_Var10 == (GLXContext)0x0) {
                                pcVar14 = "Unable to create GLX context.";
                              }
                              else {
                                iVar1 = glXIsDirect(pDVar5,p_Var10);
                                if (iVar1 != 0) goto LAB_00115c3a;
                                pcVar14 = "Unable to create direct rendering context.";
                              }
                              goto LAB_00115c33;
                            }
                            glXGetFBConfigAttrib
                                      (pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),100000,&wa);
                            if ((ksGpuSampleCount)wa.background_pixmap == 1) {
                              glXGetFBConfigAttrib
                                        (pDVar5,*(undefined8 *)(lVar11 + lVar15 * 8),0x186a1,&wa);
                              if ((ksGpuSampleCount)wa.background_pixmap == sampleCount)
                              goto LAB_00115f8d;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < fbConfigCount);
        }
        XFree(lVar11);
        Error("Failed to to find desired framebuffer configuration.");
        goto LAB_00115c3a;
      }
      pcVar14 = "No valid framebuffer configurations found.";
    }
  }
LAB_00115c33:
  Error(pcVar14);
LAB_00115c3a:
  pXVar7 = (XVisualInfo *)glXGetVisualFromFBConfig(window->xDisplay,(window->context).glxFBConfig);
  window->xVisual = pXVar7;
  if (pXVar7 == (XVisualInfo *)0x0) {
    pcVar14 = "Failed to retrieve visual for framebuffer config.";
    _Var16 = false;
  }
  else {
    wa.colormap = XCreateColormap(window->xDisplay,window->xRoot,pXVar7->visual,0);
    window->xColormap = wa.colormap;
    wa.cursor = 0;
    wa.border_pixmap = 0;
    wa.save_under = 0;
    wa._68_4_ = 0;
    wa.do_not_propagate_mask = 0;
    wa.override_redirect = 0;
    wa._92_4_ = 0;
    wa.backing_planes = 0;
    wa.backing_pixel = 0;
    wa.bit_gravity = 0;
    wa.win_gravity = 0;
    wa.backing_store = 0;
    wa._44_4_ = 0;
    wa.background_pixmap = 0;
    wa.background_pixel = 0;
    wa.border_pixel = 0;
    wa.event_mask = 0x67803f;
    WVar6 = XCreateWindow(window->xDisplay,window->xRoot,0,0,window->windowWidth,
                          window->windowHeight,0,window->xVisual->depth,1,window->xVisual->visual,
                          (window->windowFullscreen ^ 1) * 8 + 0x2800,&wa);
    window->xWindow = WVar6;
    _Var16 = WVar6 != 0;
    if (_Var16) {
      uVar8 = XInternAtom(window->xDisplay,"_NET_WM_NAME",0);
      XChangeProperty(window->xDisplay,window->xWindow,uVar8,0x1f,8,0,"OpenGL SI",9);
      if (window->windowFullscreen == true) {
        _glxEventBase = 1;
        uVar8 = XInternAtom(window->xDisplay,"_NET_WM_BYPASS_COMPOSITOR",0);
        XChangeProperty(window->xDisplay,window->xWindow,uVar8,6,0x20,0,&glxEventBase,1);
        local_48 = 1;
        XChangeWindowAttributes(window->xDisplay,window->xWindow,0x200);
        XMapRaised(window->xDisplay,window->xWindow);
        XMoveResizeWindow(window->xDisplay,window->xWindow,0,0,window->windowWidth,
                          window->windowHeight);
        XFlush(window->xDisplay);
        XGrabPointer(window->xDisplay,window->xWindow,1,0,1,1,window->xWindow,0,0);
        XGrabKeyboard(window->xDisplay,window->xWindow,1,1,1,0);
      }
      else {
        puVar9 = (undefined8 *)XAllocSizeHints();
        *puVar9 = 0x30;
        iVar1 = window->windowWidth;
        *(int *)(puVar9 + 3) = iVar1;
        *(int *)(puVar9 + 4) = iVar1;
        iVar1 = window->windowHeight;
        *(int *)((long)puVar9 + 0x1c) = iVar1;
        *(int *)((long)puVar9 + 0x24) = iVar1;
        XSetWMNormalHints(window->xDisplay,window->xWindow,puVar9);
        XFree(puVar9);
        XMapRaised(window->xDisplay,window->xWindow);
        XMoveResizeWindow(window->xDisplay,window->xWindow,
                          (window->desktopWidth - window->windowWidth) / 2,
                          (window->desktopHeight - window->windowHeight) / 2);
        XFlush(window->xDisplay);
      }
      (window->context).glxDrawable = window->xWindow;
      ksGpuContext_SetCurrent(&window->context);
      return _Var16;
    }
    pcVar14 = "Failed to create window.";
  }
  Error(pcVar14);
  ksGpuWindow_Destroy(window);
  return _Var16;
}

Assistant:

bool ksGpuWindow_Create(ksGpuWindow *window, ksDriverInstance *instance, const ksGpuQueueInfo *queueInfo, const int queueIndex,
                        const ksGpuSurfaceColorFormat colorFormat, const ksGpuSurfaceDepthFormat depthFormat,
                        const ksGpuSampleCount sampleCount, const int width, const int height, const bool fullscreen) {
    memset(window, 0, sizeof(ksGpuWindow));

    window->colorFormat = colorFormat;
    window->depthFormat = depthFormat;
    window->sampleCount = sampleCount;
    window->windowWidth = width;
    window->windowHeight = height;
    window->windowSwapInterval = 1;
    window->windowRefreshRate = 60.0f;
    window->windowFullscreen = fullscreen;
    window->windowActive = false;
    window->windowExit = false;

    const char *displayName = NULL;
    window->xDisplay = XOpenDisplay(displayName);
    if (!window->xDisplay) {
        Error("Unable to open X Display.");
        return false;
    }

    window->xScreen = XDefaultScreen(window->xDisplay);
    window->xRoot = XRootWindow(window->xDisplay, window->xScreen);

    if (window->windowFullscreen) {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, &window->desktopWidth, &window->desktopHeight,
                                    &window->desktopRefreshRate, &window->windowWidth, &window->windowHeight,
                                    &window->windowRefreshRate);
    } else {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, &window->desktopWidth, &window->desktopHeight,
                                    &window->desktopRefreshRate, NULL, NULL, NULL);
        window->windowRefreshRate = window->desktopRefreshRate;
    }

    ksGpuDevice_Create(&window->device, instance, queueInfo);
    ksGpuContext_CreateForSurface(&window->context, &window->device, queueIndex, colorFormat, depthFormat, sampleCount,
                                  window->xDisplay, window->xScreen);

    window->xVisual = glXGetVisualFromFBConfig(window->xDisplay, window->context.glxFBConfig);
    if (window->xVisual == NULL) {
        Error("Failed to retrieve visual for framebuffer config.");
        ksGpuWindow_Destroy(window);
        return false;
    }

    window->xColormap = XCreateColormap(window->xDisplay, window->xRoot, window->xVisual->visual, AllocNone);

    const unsigned long wamask = CWColormap | CWEventMask | (window->windowFullscreen ? 0 : CWBorderPixel);

    XSetWindowAttributes wa;
    memset(&wa, 0, sizeof(wa));
    wa.colormap = window->xColormap;
    wa.border_pixel = 0;
    wa.event_mask = StructureNotifyMask | PropertyChangeMask | ResizeRedirectMask | KeyPressMask | KeyReleaseMask |
                    ButtonPressMask | ButtonReleaseMask | FocusChangeMask | ExposureMask | VisibilityChangeMask | EnterWindowMask |
                    LeaveWindowMask;

    window->xWindow = XCreateWindow(window->xDisplay,         // Display * display
                                    window->xRoot,            // Window parent
                                    0,                        // int x
                                    0,                        // int y
                                    window->windowWidth,      // unsigned int width
                                    window->windowHeight,     // unsigned int height
                                    0,                        // unsigned int border_width
                                    window->xVisual->depth,   // int depth
                                    InputOutput,              // unsigned int class
                                    window->xVisual->visual,  // Visual * visual
                                    wamask,                   // unsigned long valuemask
                                    &wa);                     // XSetWindowAttributes * attributes

    if (!window->xWindow) {
        Error("Failed to create window.");
        ksGpuWindow_Destroy(window);
        return false;
    }

    // Change the window title.
    Atom _NET_WM_NAME = XInternAtom(window->xDisplay, "_NET_WM_NAME", False);
    XChangeProperty(window->xDisplay, window->xWindow, _NET_WM_NAME, XA_STRING, 8, PropModeReplace,
                    (const unsigned char *)WINDOW_TITLE, strlen(WINDOW_TITLE));

    if (window->windowFullscreen) {
        // Bypass the compositor in fullscreen mode.
        const unsigned long bypass = 1;
        Atom _NET_WM_BYPASS_COMPOSITOR = XInternAtom(window->xDisplay, "_NET_WM_BYPASS_COMPOSITOR", False);
        XChangeProperty(window->xDisplay, window->xWindow, _NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32, PropModeReplace,
                        (const unsigned char *)&bypass, 1);

        // Completely disassociate window from window manager.
        XSetWindowAttributes attributes;
        attributes.override_redirect = True;
        XChangeWindowAttributes(window->xDisplay, window->xWindow, CWOverrideRedirect, &attributes);

        // Make the window visible.
        XMapRaised(window->xDisplay, window->xWindow);
        XMoveResizeWindow(window->xDisplay, window->xWindow, 0, 0, window->windowWidth, window->windowHeight);
        XFlush(window->xDisplay);

        // Grab mouse and keyboard input now that the window is disassociated from the window manager.
        XGrabPointer(window->xDisplay, window->xWindow, True, 0, GrabModeAsync, GrabModeAsync, window->xWindow, 0L, CurrentTime);
        XGrabKeyboard(window->xDisplay, window->xWindow, True, GrabModeAsync, GrabModeAsync, CurrentTime);
    } else {
        // Make the window fixed size.
        XSizeHints *hints = XAllocSizeHints();
        hints->flags = (PMinSize | PMaxSize);
        hints->min_width = window->windowWidth;
        hints->max_width = window->windowWidth;
        hints->min_height = window->windowHeight;
        hints->max_height = window->windowHeight;
        XSetWMNormalHints(window->xDisplay, window->xWindow, hints);
        XFree(hints);

        // First map the window and then center the window on the screen.
        XMapRaised(window->xDisplay, window->xWindow);
        const int x = (window->desktopWidth - window->windowWidth) / 2;
        const int y = (window->desktopHeight - window->windowHeight) / 2;
        XMoveResizeWindow(window->xDisplay, window->xWindow, x, y, window->windowWidth, window->windowHeight);
        XFlush(window->xDisplay);
    }

    window->context.glxDrawable = window->xWindow;

    ksGpuContext_SetCurrent(&window->context);

    return true;
}